

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O3

string * __thiscall
flatbuffers::(anonymous_namespace)::ToValueString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryRegion *region,
          uint8_t *binary,OutputConfig *output_config)

{
  float fVar1;
  double dVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  string *extraout_RAX;
  string *psVar9;
  string *extraout_RAX_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar10;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  string *s_1;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t i;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  string s;
  string __str;
  _Alloc_hider local_1f8;
  string *local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  undefined8 uStack_1e0;
  long *local_1d8;
  long local_1c8 [2];
  string local_1b8 [4];
  ios_base local_138 [264];
  
  local_1f0 = (string *)0x0;
  local_1e8 = '\0';
  lVar7 = *(long *)(this + 0x18);
  iVar6 = *(int *)(this + 0x10);
  local_1f8._M_p = &local_1e8;
  if (lVar7 != 0) {
    if (iVar6 != 7) {
      if (iVar6 == 6) {
        lVar18 = (long)&region->offset + *(long *)this;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,lVar18,lVar7 + lVar18);
        psVar9 = extraout_RAX;
        goto LAB_0031a7b5;
      }
      if (iVar6 != 0) goto code_r0x0031a000;
    }
    uVar14 = 0;
    do {
      isprint((uint)*(byte *)((long)&region->offset + uVar14 + *(long *)this));
      std::__cxx11::string::push_back((char)&local_1f8);
      uVar14 = uVar14 + 1;
    } while (uVar14 < *(ulong *)(this + 0x18));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_1f8._M_p != &local_1e8) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_1f8._M_p;
      goto LAB_0031a790;
    }
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1e7,local_1e8);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1e0;
    goto LAB_0031a799;
  }
code_r0x0031a000:
  switch(iVar6) {
  case 1:
    anon_unknown_7::ToValueString<unsigned_int>(local_1b8,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1b8[0]._M_dataplus._M_p);
    goto LAB_0031a6fb;
  case 2:
    anon_unknown_7::ToValueString<int>(local_1b8,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1b8[0]._M_dataplus._M_p);
    goto LAB_0031a6fb;
  case 3:
    anon_unknown_7::ToValueString<unsigned_short>(local_1b8,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1b8[0]._M_dataplus._M_p);
    goto LAB_0031a6fb;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    bVar4 = *(byte *)((long)&region->offset + *(long *)this);
    uVar14 = (ulong)bVar4;
    if (*(long *)(this + 8) != 0) {
      pbVar15 = (byte *)((long)&region->offset + *(long *)(this + 8) + *(long *)this);
      uVar13 = 0;
      do {
        pbVar15 = pbVar15 + -1;
        ToHex_abi_cxx11_(local_1b8,(flatbuffers *)(ulong)*pbVar15,(uint8_t)uVar14);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        uVar14 = extraout_RDX_09;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
          uVar14 = extraout_RDX_10;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < *(ulong *)(this + 8));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1b8,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_1b8[0]._M_dataplus._M_p,1,(uint)bVar4);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
    }
    psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 5:
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    cVar3 = *(char *)((long)&region->offset + *(long *)this);
    uVar17 = (uint)cVar3;
    uVar14 = (ulong)uVar17;
    if (*(long *)(this + 8) != 0) {
      pbVar15 = (byte *)((long)&region->offset + *(long *)(this + 8) + *(long *)this);
      uVar13 = 0;
      do {
        pbVar15 = pbVar15 + -1;
        ToHex_abi_cxx11_(local_1b8,(flatbuffers *)(ulong)*pbVar15,(uint8_t)uVar14);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        uVar14 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
          uVar14 = extraout_RDX_00;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < *(ulong *)(this + 8));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar11 = -uVar17;
    if (0 < (int)uVar17) {
      uVar11 = uVar17;
    }
    uVar16 = 1;
    if (9 < uVar11) {
      uVar16 = 3 - (uVar11 < 100);
    }
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1b8,(char)uVar16 - (cVar3 >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1b8[0]._M_dataplus._M_p + (uVar17 >> 0x1f),uVar16,uVar11);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
    }
    psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    cVar3 = *(char *)((long)&region->offset + *(long *)this);
    uVar17 = (uint)cVar3;
    uVar14 = (ulong)uVar17;
    if (*(long *)(this + 8) != 0) {
      pbVar15 = (byte *)((long)&region->offset + *(long *)(this + 8) + *(long *)this);
      uVar13 = 0;
      do {
        pbVar15 = pbVar15 + -1;
        ToHex_abi_cxx11_(local_1b8,(flatbuffers *)(ulong)*pbVar15,(uint8_t)uVar14);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        uVar14 = extraout_RDX_11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
          uVar14 = extraout_RDX_12;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < *(ulong *)(this + 8));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar11 = -uVar17;
    if (0 < (int)uVar17) {
      uVar11 = uVar17;
    }
    uVar16 = 1;
    if (9 < uVar11) {
      uVar16 = 3 - (uVar11 < 100);
    }
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1b8,(char)uVar16 - (cVar3 >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1b8[0]._M_dataplus._M_p + (uVar17 >> 0x1f),uVar16,uVar11);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
    }
    psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 7:
  case 0x11:
    psVar9 = anon_unknown_7::ToValueString<unsigned_char>
                       (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 9:
    psVar9 = anon_unknown_7::ToValueString<unsigned_short>
                       (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar5 = *(short *)((long)&region->offset + *(long *)this);
    uVar17 = (uint)sVar5;
    uVar14 = (ulong)uVar17;
    if (*(long *)(this + 8) != 0) {
      pbVar15 = (byte *)((long)&region->offset + *(long *)(this + 8) + *(long *)this);
      uVar13 = 0;
      do {
        pbVar15 = pbVar15 + -1;
        ToHex_abi_cxx11_(local_1b8,(flatbuffers *)(ulong)*pbVar15,(uint8_t)uVar14);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        uVar14 = extraout_RDX_13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
          uVar14 = extraout_RDX_14;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < *(ulong *)(this + 8));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar11 = -uVar17;
    if (0 < (int)uVar17) {
      uVar11 = uVar17;
    }
    uVar16 = 1;
    if (((9 < uVar11) && (uVar16 = 2, 99 < uVar11)) && (uVar16 = 3, 999 < uVar11)) {
      uVar16 = 5 - (uVar11 < 10000);
    }
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1b8,(char)uVar16 - (char)(sVar5 >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1b8[0]._M_dataplus._M_p + (uVar17 >> 0x1f),uVar16,uVar11);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
    }
    psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0xb:
    psVar9 = anon_unknown_7::ToValueString<unsigned_int>
                       (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xc:
    psVar9 = anon_unknown_7::ToValueString<int>
                       (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xd:
    psVar9 = anon_unknown_7::ToValueString<unsigned_long>
                       (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar14 = *(ulong *)((long)&region->offset + *(long *)this);
    if (*(long *)(this + 8) != 0) {
      pbVar15 = (byte *)((long)&region->offset + *(long *)(this + 8) + *(long *)this);
      uVar12 = 0;
      uVar13 = uVar14;
      do {
        pbVar15 = pbVar15 + -1;
        ToHex_abi_cxx11_(local_1b8,(flatbuffers *)(ulong)*pbVar15,(uint8_t)uVar13);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        uVar13 = extraout_RDX_04;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
          uVar13 = extraout_RDX_05;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < *(ulong *)(this + 8));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar13 = -uVar14;
    if (0 < (long)uVar14) {
      uVar13 = uVar14;
    }
    uVar17 = 1;
    if (9 < uVar13) {
      uVar12 = uVar13;
      uVar11 = 4;
      do {
        uVar17 = uVar11;
        if (uVar12 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0031aa9c;
        }
        if (uVar12 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0031aa9c;
        }
        if (uVar12 < 10000) goto LAB_0031aa9c;
        bVar8 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar11 = uVar17 + 4;
      } while (bVar8);
      uVar17 = uVar17 + 1;
    }
LAB_0031aa9c:
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1b8,(char)uVar17 - (char)((long)uVar14 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_1b8[0]._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar17,uVar13);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
    }
    psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    fVar1 = *(float *)((long)&region->offset + *(long *)this);
    if (*(long *)(this + 8) != 0) {
      pbVar15 = (byte *)((long)&region->offset + *(long *)(this + 8) + *(long *)this);
      uVar14 = 0;
      uVar10 = extraout_RDX_06;
      do {
        pbVar15 = pbVar15 + -1;
        ToHex_abi_cxx11_(local_1b8,(flatbuffers *)(ulong)*pbVar15,(uint8_t)uVar10);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        uVar10 = extraout_RDX_07;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
          uVar10 = extraout_RDX_08;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < *(ulong *)(this + 8));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::_M_insert<double>((double)fVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    dVar2 = *(double *)((long)&region->offset + *(long *)this);
    if (*(long *)(this + 8) != 0) {
      pbVar15 = (byte *)((long)&region->offset + *(long *)(this + 8) + *(long *)this);
      uVar14 = 0;
      uVar10 = extraout_RDX_01;
      do {
        pbVar15 = pbVar15 + -1;
        ToHex_abi_cxx11_(local_1b8,(flatbuffers *)(ulong)*pbVar15,(uint8_t)uVar10);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        uVar10 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
          uVar10 = extraout_RDX_03;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < *(ulong *)(this + 8));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::_M_insert<double>(dVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0x12:
    anon_unknown_7::ToValueString<unsigned_long>(local_1b8,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1b8[0]._M_dataplus._M_p);
LAB_0031a6fb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
    }
switchD_0031a00e_default:
    if ((*(uint *)(this + 0x10) < 0x13) && ((0x40006U >> (*(uint *)(this + 0x10) & 0x1f) & 1) != 0))
    {
      std::__cxx11::string::append((char *)&local_1f8);
      ToHex<unsigned_long>(local_1b8,*(unsigned_long *)(this + 0x20),*(size_t *)(binary + 0x18));
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1b8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
        operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_1f8._M_p == &local_1e8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1e7,local_1e8);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1e0;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_1f8._M_p;
LAB_0031a790:
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1e7,local_1e8);
    }
LAB_0031a799:
    psVar9 = local_1f0;
    local_1f8._M_p = &local_1e8;
    __return_storage_ptr__->_M_string_length = (size_type)local_1f0;
    local_1f0 = (string *)0x0;
    local_1e8 = '\0';
    break;
  default:
    goto switchD_0031a00e_default;
  }
LAB_0031a7b5:
  if (local_1f8._M_p != &local_1e8) {
    operator_delete(local_1f8._M_p,CONCAT71(uStack_1e7,local_1e8) + 1);
    psVar9 = extraout_RAX_00;
  }
  return psVar9;
}

Assistant:

static std::string ToValueString(const BinaryRegion &region,
                                 const uint8_t *binary,
                                 const OutputConfig &output_config) {
  std::string s;

  if (region.array_length) {
    if (region.type == BinaryRegionType::Uint8 ||
        region.type == BinaryRegionType::Unknown) {
      // Interpret each value as a ASCII to aid debugging
      for (uint64_t i = 0; i < region.array_length; ++i) {
        const uint8_t c = *(binary + region.offset + i);
        s += isprint(c) ? static_cast<char>(c & 0x7F) : '.';
      }
      return s;
    } else if (region.type == BinaryRegionType::Char) {
      // string value
      return ToValueString<std::string>(region, binary);
    }
  }

  switch (region.type) {
    case BinaryRegionType::Uint32:
      return ToValueString<uint32_t>(region, binary);
    case BinaryRegionType::Int32: return ToValueString<int32_t>(region, binary);
    case BinaryRegionType::Uint16:
      return ToValueString<uint16_t>(region, binary);
    case BinaryRegionType::Int16: return ToValueString<int16_t>(region, binary);
    case BinaryRegionType::Bool: return ToValueString<bool>(region, binary);
    case BinaryRegionType::Uint8: return ToValueString<uint8_t>(region, binary);
    case BinaryRegionType::Char: return ToValueString<char>(region, binary);
    case BinaryRegionType::Byte:
    case BinaryRegionType::Int8: return ToValueString<int8_t>(region, binary);
    case BinaryRegionType::Int64: return ToValueString<int64_t>(region, binary);
    case BinaryRegionType::Uint64:
      return ToValueString<uint64_t>(region, binary);
    case BinaryRegionType::Double: return ToValueString<double>(region, binary);
    case BinaryRegionType::Float: return ToValueString<float>(region, binary);
    case BinaryRegionType::UType: return ToValueString<uint8_t>(region, binary);

    // Handle Offsets separately, incase they add additional details.
    case BinaryRegionType::UOffset64:
      s += ToValueString<uint64_t>(region, binary);
      break;
    case BinaryRegionType::UOffset:
      s += ToValueString<uint32_t>(region, binary);
      break;
    case BinaryRegionType::SOffset:
      s += ToValueString<int32_t>(region, binary);
      break;
    case BinaryRegionType::VOffset:
      s += ToValueString<uint16_t>(region, binary);
      break;

    default: break;
  }
  // If this is an offset type, include the calculated offset location in the
  // value.
  // TODO(dbaileychess): It might be nicer to put this in the comment field.
  if (IsOffset(region.type)) {
    s += " Loc: 0x";
    s += ToHex(region.points_to_offset, output_config.offset_max_char);
  }
  return s;
}